

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.cpp
# Opt level: O3

int __thiscall cali::Attribute::properties(Attribute *this)

{
  int iVar1;
  Node *pNVar2;
  
  pNVar2 = this->m_node;
  while( true ) {
    if (pNVar2 == (Node *)0x0) {
      return 0;
    }
    if (pNVar2->m_attribute == 10) break;
    pNVar2 = *(Node **)((long)&(((pNVar2->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                               super_LockfreeIntrusiveTree<cali::Node>).m_me +
                       (pNVar2->super_LockfreeIntrusiveTree<cali::Node>).m_node);
  }
  iVar1 = cali_variant_to_int((pNVar2->m_data).m_v,(_Bool *)0x0);
  return iVar1;
}

Assistant:

int Attribute::properties() const
{
    for (const Node* node = m_node; node; node = node->parent())
        if (node->attribute() == PROP_ATTR_ID)
            return node->data().to_int();

    return CALI_ATTR_DEFAULT;
}